

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

ValueType __thiscall IRBuilderAsmJs::GetSimdValueTypeFromIRType(IRBuilderAsmJs *this,IRType type)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IRType type_local;
  IRBuilderAsmJs *this_local;
  
  switch(type) {
  case TySimd128F4:
    this_local._6_2_ = ValueType::Simd.field_0;
    break;
  case TySimd128I4:
    this_local._6_2_ = ValueType::Simd.field_0;
    break;
  case TySimd128I8:
    this_local._6_2_ = ValueType::Simd.field_0;
    break;
  case TySimd128I16:
    this_local._6_2_ = ValueType::Simd.field_0;
    break;
  case TySimd128U4:
    this_local._6_2_ = ValueType::Simd.field_0;
    break;
  case TySimd128U8:
    this_local._6_2_ = ValueType::Simd.field_0;
    break;
  case TySimd128U16:
    this_local._6_2_ = ValueType::Simd.field_0;
    break;
  case TySimd128B4:
    this_local._6_2_ = ValueType::Simd.field_0;
    break;
  case TySimd128B8:
    this_local._6_2_ = ValueType::Simd.field_0;
    break;
  case TySimd128B16:
    this_local._6_2_ = ValueType::Simd.field_0;
    break;
  case TySimd128I2:
    this_local._6_2_ = ValueType::Simd.field_0;
    break;
  case TySimd128D2:
    this_local._6_2_ = ValueType::Simd.field_0;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x1a2e,"((0))","UNREACHED");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr();
    *puVar3 = 0;
    this_local._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(UninitializedObject);
  }
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)this_local._6_2_;
}

Assistant:

ValueType IRBuilderAsmJs::GetSimdValueTypeFromIRType(IRType type)
{
    switch (type)
    {
    case TySimd128F4:
        return ValueType::Simd;
    case TySimd128D2:
        return ValueType::Simd;
    case TySimd128I2:
        return ValueType::Simd;
    case TySimd128I4:
        return ValueType::Simd;
    case TySimd128I8:
        return ValueType::Simd;
    case TySimd128I16:
        return ValueType::Simd;
    case TySimd128U4:
        return ValueType::Simd;
    case TySimd128U8:
        return ValueType::Simd;
    case TySimd128U16:
        return ValueType::Simd;
    case TySimd128B4:
        return ValueType::Simd;
    case TySimd128B8:
        return ValueType::Simd;
    case TySimd128B16:
        return ValueType::Simd;
    default:
        Assert(UNREACHED);
    }
    return ValueType::GetObject(ObjectType::UninitializedObject);

}